

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5lib.c
# Opt level: O3

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  size_t lcyphertext;
  char block [272];
  luaL_Buffer b;
  ulong local_2188;
  long local_2180;
  byte local_2178 [16];
  char local_2168 [280];
  luaL_Buffer local_2050;
  
  pcVar3 = luaL_checklstring((lua_State *)ctx,1,&local_2188);
  cVar1 = *pcVar3;
  uVar6 = (long)cVar1 + 1;
  if (0x10 < (ulong)(long)cVar1 || local_2188 < uVar6) {
    luaL_argerror((lua_State *)ctx,1,"invalid cyphered string");
  }
  local_2188 = local_2188 - uVar6;
  iVar2 = initblock((lua_State *)ctx,pcVar3 + 1,(int)cVar1,local_2168);
  uVar7 = local_2188;
  luaL_buffinit((lua_State *)ctx,&local_2050);
  if (uVar7 != 0) {
    pbVar5 = (byte *)(pcVar3 + uVar6);
    local_2180 = (long)iVar2;
    do {
      md5(local_2168,local_2180,(char *)local_2178);
      uVar7 = uVar7 - 1;
      uVar6 = 0xf;
      if (uVar7 < 0xf) {
        uVar6 = uVar7;
      }
      uVar4 = 0xffffffffffffffff;
      do {
        local_2178[uVar4 + 1] = local_2178[uVar4 + 1] ^ *pbVar5;
        pbVar5 = pbVar5 + 1;
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar6);
      luaL_addlstring(&local_2050,(char *)local_2178,uVar6 + 1);
      memcpy(local_2168,pbVar5 + ~uVar6,uVar6 + 1);
      uVar7 = uVar7 - uVar6;
    } while (uVar7 != 0);
  }
  luaL_pushresult(&local_2050);
  return 1;
}

Assistant:

static int decrypt (lua_State *L) {
  size_t lcyphertext;
  const char *cyphertext = luaL_checklstring(L, 1, &lcyphertext);
  size_t lseed = cyphertext[0];
  const char *seed = cyphertext+1;
  int lblock;
  char block[BLOCKSIZE+MAXKEY];
  luaL_argcheck(L, lcyphertext >= lseed+1 && lseed <= BLOCKSIZE, 1,
                 "invalid cyphered string");
  cyphertext += lseed+1;
  lcyphertext -= lseed+1;
  lblock = initblock(L, seed, lseed, block);
  decodestream(L, cyphertext, lcyphertext, block, lblock);
  return 1;
}